

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7enc.c
# Opt level: O0

void compute_least_squares_endpoints_a
               (uint32_t N,uint8_t *pSelectors,vec4F *pSelector_weights,float *pXl,float *pXh,
               color_quad_u8 *pColors)

{
  uint uVar1;
  float *in_RCX;
  long in_RDX;
  long in_RSI;
  uint in_EDI;
  float *in_R8;
  long in_R9;
  uint32_t i_1;
  uint32_t hi_v;
  uint32_t lo_v;
  float iz11;
  float iz10;
  float iz01;
  float iz00;
  float det;
  float w;
  uint32_t sel;
  uint32_t i;
  float t_a;
  float q10_a;
  float q00_a;
  float z11;
  float z10;
  float z01;
  float z00;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_5c;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_34;
  
  local_34 = 0.0;
  local_3c = 0.0;
  local_40 = 0.0;
  local_44 = 0.0;
  local_4c = 0.0;
  for (local_50 = 0; local_50 < in_EDI; local_50 = local_50 + 1) {
    uVar1 = (uint)*(byte *)(in_RSI + (ulong)local_50);
    local_34 = *(float *)(in_RDX + (ulong)uVar1 * 0x10) + local_34;
    local_3c = *(float *)(in_RDX + (ulong)uVar1 * 0x10 + 4) + local_3c;
    local_40 = *(float *)(in_RDX + (ulong)uVar1 * 0x10 + 8) + local_40;
    local_44 = *(float *)(in_RDX + (ulong)uVar1 * 0x10 + 0xc) *
               (float)*(byte *)(in_R9 + 3 + (ulong)local_50 * 4) + local_44;
    local_4c = (float)*(byte *)(in_R9 + 3 + (ulong)local_50 * 4) + local_4c;
  }
  local_5c = local_34 * local_40 + -(local_3c * local_3c);
  if ((local_5c != 0.0) || (NAN(local_5c))) {
    local_5c = 1.0 / local_5c;
  }
  *in_RCX = local_40 * local_5c * local_44 + -local_3c * local_5c * (local_4c - local_44);
  *in_R8 = -local_3c * local_5c * local_44 + local_34 * local_5c * (local_4c - local_44);
  if ((*in_RCX <= 0.0 && *in_RCX != 0.0) || (255.0 < *in_R8)) {
    local_70 = 0xffffffff;
    local_74 = 0;
    for (local_78 = 0; local_78 < in_EDI; local_78 = local_78 + 1) {
      local_70 = minimumu(local_70,(uint)*(byte *)(in_R9 + 3 + (ulong)local_78 * 4));
      local_74 = maximumu(local_74,(uint)*(byte *)(in_R9 + 3 + (ulong)local_78 * 4));
    }
    if (local_70 == local_74) {
      *in_RCX = (float)local_70;
      *in_R8 = (float)local_74;
    }
  }
  return;
}

Assistant:

static void compute_least_squares_endpoints_a(uint32_t N, const uint8_t* pSelectors, const vec4F* pSelector_weights, float* pXl, float* pXh, const color_quad_u8* pColors)
{
	// Least squares using normal equations: http://www.cs.cornell.edu/~bindel/class/cs3220-s12/notes/lec10.pdf 
	// I did this in matrix form first, expanded out all the ops, then optimized it a bit.
	float z00 = 0.0f, z01 = 0.0f, z10 = 0.0f, z11 = 0.0f;
	float q00_a = 0.0f, q10_a = 0.0f, t_a = 0.0f;
	for (uint32_t i = 0; i < N; i++)
	{
		const uint32_t sel = pSelectors[i];

		z00 += pSelector_weights[sel].m_c[0];
		z10 += pSelector_weights[sel].m_c[1];
		z11 += pSelector_weights[sel].m_c[2];

		float w = pSelector_weights[sel].m_c[3];

		q00_a += w * pColors[i].m_c[3]; t_a += pColors[i].m_c[3];
	}

	q10_a = t_a - q00_a;

	z01 = z10;

	float det = z00 * z11 - z01 * z10;
	if (det != 0.0f)
		det = 1.0f / det;

	float iz00, iz01, iz10, iz11;
	iz00 = z11 * det;
	iz01 = -z01 * det;
	iz10 = -z10 * det;
	iz11 = z00 * det;

	*pXl = (float)(iz00 * q00_a + iz01 * q10_a); *pXh = (float)(iz10 * q00_a + iz11 * q10_a);

	if ((*pXl < 0.0f) || (*pXh > 255.0f))
	{
		uint32_t lo_v = UINT32_MAX, hi_v = 0;
		for (uint32_t i = 0; i < N; i++)
		{
			lo_v = minimumu(lo_v, pColors[i].m_c[3]);
			hi_v = maximumu(hi_v, pColors[i].m_c[3]);
		}

		if (lo_v == hi_v)
		{
			*pXl = (float)lo_v;
			*pXh = (float)hi_v;
		}
	}
}